

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hpp
# Opt level: O1

int actorpp::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  runtime_error *prVar4;
  uint uVar5;
  ulong uVar6;
  uint __val;
  undefined4 in_register_0000003c;
  uint uVar7;
  addrinfo *res;
  string port_str;
  addrinfo hints;
  addrinfo *local_90;
  long *local_88 [2];
  long local_78 [2];
  addrinfo local_68;
  
  uVar7 = (uint)__addr;
  local_68.ai_flags = 0;
  local_68.ai_protocol = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_family = 2;
  local_68.ai_socktype = 1;
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar1 = 4;
    do {
      uVar7 = uVar1;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_0011289c;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_0011289c;
      }
      if (uVar5 < 10000) goto LAB_0011289c;
      uVar6 = uVar6 / 10000;
      uVar1 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_0011289c:
  uVar6 = (ulong)__addr >> 0x1f & 1;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct((ulong)local_88,(char)uVar7 + (char)uVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)((long)local_88[0] + uVar6),uVar7,__val);
  iVar2 = getaddrinfo(*(char **)CONCAT44(in_register_0000003c,__fd),(char *)local_88[0],&local_68,
                      &local_90);
  if ((iVar2 == 0) && (local_90 != (addrinfo *)0x0)) {
    iVar2 = socket(local_90->ai_family,local_90->ai_socktype,0);
    if (iVar2 < 0) {
      freeaddrinfo(local_90);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"failed to allocate socket");
    }
    else {
      iVar3 = ::connect(iVar2,local_90->ai_addr,local_90->ai_addrlen);
      if (iVar3 == 0) {
        freeaddrinfo(local_90);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        return iVar2;
      }
      close(iVar2);
      freeaddrinfo(local_90);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"failed to connect");
    }
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"dns lookup failed");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int connect(const std::string &hostname, int port) {
  struct addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_INET;
  hints.ai_socktype = SOCK_STREAM;
  struct addrinfo *res;

  std::string port_str = std::to_string(port);
  int err = getaddrinfo(hostname.c_str(), port_str.c_str(), &hints, &res);

  if (err != 0 || res == NULL) {
    throw std::runtime_error("dns lookup failed");
  }

  int sockfd = socket(res->ai_family, res->ai_socktype, 0);
  if (sockfd < 0) {
    freeaddrinfo(res);
    throw std::runtime_error("failed to allocate socket");
  }

  if (connect(sockfd, res->ai_addr, res->ai_addrlen) != 0) {
    close(sockfd);
    freeaddrinfo(res);
    throw std::runtime_error("failed to connect");
  }

  freeaddrinfo(res);

  return sockfd;
}